

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O1

void __thiscall
t_netstd_generator::generate_process_function_async
          (t_netstd_generator *this,ostream *out,t_service *tservice,t_function *tfunction)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int *piVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pcVar5;
  t_struct *ptVar6;
  bool bVar7;
  t_function *ptVar8;
  int iVar9;
  ostream *poVar10;
  ostream *poVar11;
  long *plVar12;
  undefined4 extraout_var;
  size_type *psVar13;
  pointer pptVar14;
  t_struct *scope;
  string tmpex;
  string tmpvar;
  string resultname;
  string argsname;
  string tmpResult;
  string args;
  string local_2d8;
  string local_2b8;
  string local_298;
  ostream *local_278;
  string local_270;
  string local_250;
  t_struct *local_230;
  string local_228;
  t_function *local_208;
  string local_200;
  string local_1e0;
  _Base_ptr local_1c0;
  _Base_ptr local_1b8;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  t_generator::indent_abi_cxx11_(&local_250,(t_generator *)this);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (out,local_250._M_dataplus._M_p,local_250._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,"public async global::System.Threading.Tasks.Task ",0x31);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,(tfunction->name_)._M_dataplus._M_p,
                       (tfunction->name_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,"_ProcessAsync(int seqid, TProtocol iprot, TProtocol oprot, CancellationToken "
             ,0x4d);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,CANCELLATION_TOKEN_NAME_abi_cxx11_._M_dataplus._M_p,
                       CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  t_generator::indent_abi_cxx11_(&local_270,(t_generator *)this);
  local_278 = out;
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,local_270._M_dataplus._M_p,local_270._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  pcVar5 = (tfunction->name_)._M_dataplus._M_p;
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_250,pcVar5,pcVar5 + (tfunction->name_)._M_string_length);
  std::__cxx11::string::append((char *)&local_250);
  pcVar5 = (tfunction->name_)._M_dataplus._M_p;
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_270,pcVar5,pcVar5 + (tfunction->name_)._M_string_length);
  std::__cxx11::string::append((char *)&local_270);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"tmp","");
  t_generator::tmp(&local_1b0,(t_generator *)this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_200,(t_generator *)this);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (local_278,local_200._M_dataplus._M_p,local_200._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"var ",4);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," = new InternalStructs.",0x17);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,local_250._M_dataplus._M_p,local_250._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"();",3);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  t_generator::indent_abi_cxx11_(&local_2d8,(t_generator *)this);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,local_2d8._M_dataplus._M_p,local_2d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"await ",6);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,".ReadAsync(iprot, ",0x12);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,CANCELLATION_TOKEN_NAME_abi_cxx11_._M_dataplus._M_p,
                       CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,");",2);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  t_generator::indent_abi_cxx11_(&local_2b8,(t_generator *)this);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,"await iprot.ReadMessageEndAsync(",0x20);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,CANCELLATION_TOKEN_NAME_abi_cxx11_._M_dataplus._M_p,
                       CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,");",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"tmp","");
  t_generator::tmp(&local_200,(t_generator *)this,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  poVar10 = local_278;
  if (tfunction->oneway_ == false) {
    t_generator::indent_abi_cxx11_(&local_2d8,(t_generator *)this);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_2d8._M_dataplus._M_p,local_2d8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"var ",4);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,local_200._M_dataplus._M_p,local_200._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," = new InternalStructs.",0x17);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,local_270._M_dataplus._M_p,local_270._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"();",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p);
    }
  }
  t_generator::indent_abi_cxx11_(&local_2d8,(t_generator *)this);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,local_2d8._M_dataplus._M_p,local_2d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"try",3);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  t_generator::indent_abi_cxx11_(&local_2b8,(t_generator *)this);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  local_230 = tfunction->xceptions_;
  if ((local_230->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (local_230->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    t_generator::indent_abi_cxx11_(&local_2d8,(t_generator *)this);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_2d8._M_dataplus._M_p,local_2d8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"try",3);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
    t_generator::indent_abi_cxx11_(&local_2b8,(t_generator *)this);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"{",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p);
    }
    piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar2 = *piVar2 + 1;
  }
  ptVar6 = tfunction->arglist_;
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"deprecated","");
  local_1b8 = (_Base_ptr)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&(tfunction->annotations_)._M_t,&local_2d8);
  local_1c0 = &(tfunction->annotations_)._M_t._M_impl.super__Rb_tree_header._M_header;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  if (local_1c0 != local_1b8) {
    t_generator::indent_abi_cxx11_(&local_2d8,(t_generator *)this);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_2d8._M_dataplus._M_p,local_2d8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"#pragma warning disable CS0618,CS0612",0x25);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p);
    }
  }
  t_generator::indent_abi_cxx11_(&local_2d8,(t_generator *)this);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,local_2d8._M_dataplus._M_p,local_2d8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  if ((tfunction->oneway_ == false) &&
     (iVar9 = (*(tfunction->returntype_->super_t_doc)._vptr_t_doc[4])(), (char)iVar9 == '\0')) {
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_200._M_dataplus._M_p,local_200._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,".Success = ",0xb);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"await _iAsync.",0xe);
  pcVar5 = (tfunction->name_)._M_dataplus._M_p;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar5,pcVar5 + (tfunction->name_)._M_string_length);
  normalize_name(&local_2b8,this,&local_90,false);
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_2b8);
  psVar13 = (size_type *)(plVar12 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_190.field_2._M_allocated_capacity = *psVar13;
    local_190.field_2._8_8_ = plVar12[3];
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  }
  else {
    local_190.field_2._M_allocated_capacity = *psVar13;
    local_190._M_dataplus._M_p = (pointer)*plVar12;
  }
  local_190._M_string_length = plVar12[1];
  *plVar12 = (long)psVar13;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  func_name(&local_2d8,this,&local_190,false);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (local_278,local_2d8._M_dataplus._M_p,local_2d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"(",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  scope = local_230;
  pptVar14 = (ptVar6->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (pptVar14 !=
      (ptVar6->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      collect_extensions_types(this,(*pptVar14)->type_);
      pptVar14 = pptVar14 + 1;
    } while (pptVar14 !=
             (ptVar6->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  iVar9 = (*(ptVar6->super_t_type).super_t_doc._vptr_t_doc[3])(ptVar6);
  prepare_member_name_mapping(this,ptVar6,&ptVar6->members_,(string *)CONCAT44(extraout_var,iVar9));
  pptVar14 = (ptVar6->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  bVar7 = true;
  local_208 = tfunction;
  if (pptVar14 !=
      (ptVar6->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      if (bVar7) {
        bVar7 = false;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(local_278,", ",2);
      }
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          (local_278,local_1b0._M_dataplus._M_p,local_1b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,".",1);
      prop_name_abi_cxx11_(&local_2d8,this,*pptVar14,false);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10,local_2d8._M_dataplus._M_p,local_2d8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p);
      }
      pptVar14 = pptVar14 + 1;
      scope = local_230;
    } while (pptVar14 !=
             (ptVar6->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  cleanup_member_name_mapping(this,ptVar6);
  poVar10 = local_278;
  if (!bVar7) {
    std::__ostream_insert<char,std::char_traits<char>>(local_278,", ",2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"",0);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,CANCELLATION_TOKEN_NAME_abi_cxx11_._M_dataplus._M_p,
                       CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,");",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if (local_1c0 != local_1b8) {
    t_generator::indent_abi_cxx11_(&local_2d8,(t_generator *)this);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_2d8._M_dataplus._M_p,local_2d8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,"#pragma warning restore CS0618,CS0612",0x25);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p);
    }
  }
  for (pptVar14 = (scope->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      pptVar14 !=
      (scope->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar14 = pptVar14 + 1) {
    collect_extensions_types(this,(*pptVar14)->type_);
  }
  prepare_member_name_mapping(this,scope,&scope->members_,&local_270);
  if ((scope->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (scope->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar2 = *piVar2 + -1;
    t_generator::indent_abi_cxx11_(&local_2d8,(t_generator *)this);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_2d8._M_dataplus._M_p,local_2d8._M_string_length);
    ptVar6 = local_230;
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"}",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p);
    }
    pptVar14 = (ptVar6->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if (pptVar14 !=
        (ptVar6->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"tmp","");
        t_generator::tmp(&local_2d8,(t_generator *)this,&local_b0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p);
        }
        t_generator::indent_abi_cxx11_(&local_2b8,(t_generator *)this);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"catch (",7);
        type_name_abi_cxx11_(&local_298,this,(*pptVar14)->type_,true);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,local_298._M_dataplus._M_p,local_298._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,local_2d8._M_dataplus._M_p,local_2d8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,")",1);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,
                             ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_228,(t_generator *)this);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,local_228._M_dataplus._M_p,local_228._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"{",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p);
        }
        if (local_208->oneway_ == false) {
          piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar2 = *piVar2 + 1;
          t_generator::indent_abi_cxx11_(&local_2b8,(t_generator *)this);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar10,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,local_200._M_dataplus._M_p,local_200._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,".",1);
          prop_name_abi_cxx11_(&local_298,this,*pptVar14,false);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,local_298._M_dataplus._M_p,local_298._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," = ",3);
          poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar11,local_2d8._M_dataplus._M_p,local_2d8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11,";",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298._M_dataplus._M_p != &local_298.field_2) {
            operator_delete(local_298._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
            operator_delete(local_2b8._M_dataplus._M_p);
          }
          piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
          *piVar2 = *piVar2 + -1;
        }
        t_generator::indent_abi_cxx11_(&local_2b8,(t_generator *)this);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar10,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"}",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
          operator_delete(local_2d8._M_dataplus._M_p);
        }
        pptVar14 = pptVar14 + 1;
      } while (pptVar14 !=
               (local_230->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
  }
  ptVar8 = local_208;
  if (local_208->oneway_ == false) {
    t_generator::indent_abi_cxx11_(&local_2d8,(t_generator *)this);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_2d8._M_dataplus._M_p,local_2d8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"await oprot.WriteMessageBeginAsync(new TMessage(\"",0x31);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(ptVar8->name_)._M_dataplus._M_p,(ptVar8->name_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"\", TMessageType.Reply, seqid), ",0x1f);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,CANCELLATION_TOKEN_NAME_abi_cxx11_._M_dataplus._M_p,
                         CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"); ",3);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
    t_generator::indent_abi_cxx11_(&local_2b8,(t_generator *)this);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"await ",6);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_200._M_dataplus._M_p,local_200._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,".WriteAsync(oprot, ",0x13);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,CANCELLATION_TOKEN_NAME_abi_cxx11_._M_dataplus._M_p,
                         CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,");",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p);
    }
  }
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  cleanup_member_name_mapping(this,local_230);
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"tmp","");
  t_generator::tmp(&local_2d8,(t_generator *)this,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_2b8,(t_generator *)this);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (local_278,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"}",1);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  t_generator::indent_abi_cxx11_(&local_298,(t_generator *)this);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,local_298._M_dataplus._M_p,local_298._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"catch (TTransportException)",0x1b);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  t_generator::indent_abi_cxx11_(&local_228,(t_generator *)this);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,local_228._M_dataplus._M_p,local_228._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"{",1);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  t_generator::indent_abi_cxx11_(&local_1e0,(t_generator *)this);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  throw;",8);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  t_generator::indent_abi_cxx11_(&local_f0,(t_generator *)this);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,local_f0._M_dataplus._M_p,local_f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"}",1);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,local_110._M_dataplus._M_p,local_110._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"catch (Exception ",0x11);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,local_2d8._M_dataplus._M_p,local_2d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,local_130._M_dataplus._M_p,local_130._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  paVar3 = &local_1e0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar3) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  paVar4 = &local_228.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar4) {
    operator_delete(local_228._M_dataplus._M_p);
  }
  paVar1 = &local_298.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"tmp","");
  t_generator::tmp(&local_2b8,(t_generator *)this,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_298,(t_generator *)this);
  poVar10 = local_278;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (local_278,local_298._M_dataplus._M_p,local_298._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"var ",4);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11," = $\"Error occurred in {GetType().FullName}: {",0x2e);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,local_2d8._M_dataplus._M_p,local_2d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,".Message}\";",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_298,(t_generator *)this);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,local_298._M_dataplus._M_p,local_298._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"if(_logger != null)",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&local_298,(t_generator *)this);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,local_298._M_dataplus._M_p,local_298._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"_logger.LogError(",0x11);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,local_2d8._M_dataplus._M_p,local_2d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,", ",2);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,");",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  t_generator::indent_abi_cxx11_(&local_298,(t_generator *)this);
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,local_298._M_dataplus._M_p,local_298._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"else",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar11,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&local_298,(t_generator *)this);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,local_298._M_dataplus._M_p,local_298._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"Console.Error.WriteLine(",0x18);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,");",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  iVar9 = (this->super_t_oop_generator).super_t_generator.indent_;
  (this->super_t_oop_generator).super_t_generator.indent_ = iVar9 + -1;
  if (local_208->oneway_ == true) {
    (this->super_t_oop_generator).super_t_generator.indent_ = iVar9 + -2;
    t_generator::indent_abi_cxx11_(&local_298,(t_generator *)this);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (local_278,local_298._M_dataplus._M_p,local_298._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"}",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  else {
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"tmp","");
    t_generator::tmp(&local_298,(t_generator *)this,&local_170);
    std::__cxx11::string::operator=((string *)&local_2b8,(string *)&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    t_generator::indent_abi_cxx11_(&local_298,(t_generator *)this);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (local_278,local_298._M_dataplus._M_p,local_298._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"var ",4);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,
               " = new TApplicationException(TApplicationException.ExceptionType.InternalError,\" Internal error.\");"
               ,99);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
    t_generator::indent_abi_cxx11_(&local_228,(t_generator *)this);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_228._M_dataplus._M_p,local_228._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"await oprot.WriteMessageBeginAsync(new TMessage(\"",0x31);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(local_208->name_)._M_dataplus._M_p,
                         (local_208->name_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"\", TMessageType.Exception, seqid), ",0x23);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,CANCELLATION_TOKEN_NAME_abi_cxx11_._M_dataplus._M_p,
                         CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,");",2);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
    t_generator::indent_abi_cxx11_(&local_1e0,(t_generator *)this);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"await ",6);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_2b8._M_dataplus._M_p,local_2b8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,".WriteAsync(oprot, ",0x13);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,CANCELLATION_TOKEN_NAME_abi_cxx11_._M_dataplus._M_p,
                         CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,");",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != paVar3) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != paVar4) {
      operator_delete(local_228._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p != paVar1) {
      operator_delete(local_298._M_dataplus._M_p);
    }
    piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar2 = *piVar2 + -1;
    t_generator::indent_abi_cxx11_(&local_298,(t_generator *)this);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (local_278,local_298._M_dataplus._M_p,local_298._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"}",1);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
    t_generator::indent_abi_cxx11_(&local_228,(t_generator *)this);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_228._M_dataplus._M_p,local_228._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"await oprot.WriteMessageEndAsync(",0x21);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,CANCELLATION_TOKEN_NAME_abi_cxx11_._M_dataplus._M_p,
                         CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,");",2);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,
                         ::endl_abi_cxx11_._M_string_length);
    t_generator::indent_abi_cxx11_(&local_1e0,(t_generator *)this);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"await oprot.Transport.FlushAsync(",0x21);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,CANCELLATION_TOKEN_NAME_abi_cxx11_._M_dataplus._M_p,
                         CANCELLATION_TOKEN_NAME_abi_cxx11_._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,");",2);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e0._M_dataplus._M_p != paVar3) {
      operator_delete(local_1e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != paVar4) {
      operator_delete(local_228._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  t_generator::indent_abi_cxx11_(&local_298,(t_generator *)this);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (local_278,local_298._M_dataplus._M_p,local_298._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"}",1);
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                      );
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar10,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != paVar1) {
    operator_delete(local_298._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_netstd_generator::generate_process_function_async(ostream& out, t_service* tservice, t_function* tfunction)
{
    (void)tservice;
    out << indent() << "public async global::System.Threading.Tasks.Task " << tfunction->get_name()
        << "_ProcessAsync(int seqid, TProtocol iprot, TProtocol oprot, CancellationToken " << CANCELLATION_TOKEN_NAME << ")" << endl
        << indent() << "{" << endl;
    indent_up();

    string argsname = tfunction->get_name() + "_args";
    string resultname = tfunction->get_name() + "_result";

    string args = tmp("tmp");
    out << indent() << "var " << args << " = new InternalStructs." << argsname << "();" << endl
        << indent() << "await " << args << ".ReadAsync(iprot, " << CANCELLATION_TOKEN_NAME << ");" << endl
        << indent() << "await iprot.ReadMessageEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;

    string tmpResult = tmp("tmp");
    if (!tfunction->is_oneway())
    {
        out << indent() << "var " << tmpResult << " = new InternalStructs." << resultname << "();" << endl;
    }

    out << indent() << "try" << endl
        << indent() << "{" << endl;
    indent_up();

    t_struct* xs = tfunction->get_xceptions();
    const vector<t_field*>& xceptions = xs->get_members();

    if (xceptions.size() > 0)
    {
        out << indent() << "try" << endl
            << indent() << "{" << endl;
        indent_up();
    }

    t_struct* arg_struct = tfunction->get_arglist();
    const vector<t_field*>& fields = arg_struct->get_members();
    vector<t_field*>::const_iterator f_iter;

    bool is_deprecated = (tfunction->annotations_.end() != tfunction->annotations_.find("deprecated"));
    if( is_deprecated) {
      out << indent() << "#pragma warning disable CS0618,CS0612" << endl;
    }

    out << indent();
    if (!tfunction->is_oneway() && !tfunction->get_returntype()->is_void())
    {
        out << tmpResult << ".Success = ";
    }

    out << "await _iAsync." << func_name(normalize_name(tfunction->get_name()) + (add_async_postfix ? "Async" : "")) << "(";

    bool first = true;
    collect_extensions_types(arg_struct);
    prepare_member_name_mapping(arg_struct);
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter)
    {
        if (first)
        {
            first = false;
        }
        else
        {
            out << ", ";
        }

        out << args << "." << prop_name(*f_iter);
    }

    cleanup_member_name_mapping(arg_struct);

    if (!first)
    {
        out << ", ";
    }

    out << "" << CANCELLATION_TOKEN_NAME << ");" << endl;

    if( is_deprecated) {
      out << indent() << "#pragma warning restore CS0618,CS0612" << endl;
    }

    vector<t_field*>::const_iterator x_iter;

    collect_extensions_types(xs);
    prepare_member_name_mapping(xs, xs->get_members(), resultname);
    if (xceptions.size() > 0)
    {
        indent_down();
        out << indent() << "}" << endl;

        for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter)
        {
            string tmpex = tmp("tmp");
            out << indent() << "catch (" << type_name((*x_iter)->get_type()) << " " << tmpex << ")" << endl
                << indent() << "{" << endl;

            if (!tfunction->is_oneway())
            {
                indent_up();
                out << indent() << tmpResult << "." << prop_name(*x_iter) << " = " << tmpex << ";" << endl;
                indent_down();
            }
            out << indent() << "}" << endl;
        }
    }

    if (!tfunction->is_oneway())
    {
        out << indent() << "await oprot.WriteMessageBeginAsync(new TMessage(\""
                << tfunction->get_name() << "\", TMessageType.Reply, seqid), " << CANCELLATION_TOKEN_NAME << "); " << endl
            << indent() << "await " << tmpResult << ".WriteAsync(oprot, " << CANCELLATION_TOKEN_NAME << ");" << endl;
    }
    indent_down();

    cleanup_member_name_mapping(xs);

    string tmpex = tmp("tmp");
    out << indent() << "}" << endl
        << indent() << "catch (TTransportException)" << endl
        << indent() << "{" << endl
        << indent() << "  throw;" << endl
        << indent() << "}" << endl
        << indent() << "catch (Exception " << tmpex << ")" << endl
        << indent() << "{" << endl;
    indent_up();

    string tmpvar = tmp("tmp");
    out << indent() << "var " << tmpvar << " = $\"Error occurred in {GetType().FullName}: {" << tmpex << ".Message}\";" << endl;
    out << indent() << "if(_logger != null)" << endl;
    indent_up();
    out << indent() << "_logger.LogError(" << tmpex << ", " << tmpvar << ");" << endl;
    indent_down();
    out << indent() << "else" << endl;
    indent_up();
    out << indent() << "Console.Error.WriteLine(" << tmpvar << ");" << endl;
    indent_down();

    if (tfunction->is_oneway())
    {
        indent_down();
        out << indent() << "}" << endl;
    }
    else
    {
        tmpvar = tmp("tmp");
        out << indent() << "var " << tmpvar << " = new TApplicationException(TApplicationException.ExceptionType.InternalError,\" Internal error.\");" << endl
            << indent() << "await oprot.WriteMessageBeginAsync(new TMessage(\"" << tfunction->get_name()
            << "\", TMessageType.Exception, seqid), " << CANCELLATION_TOKEN_NAME << ");" << endl
            << indent() << "await " << tmpvar << ".WriteAsync(oprot, " << CANCELLATION_TOKEN_NAME << ");" << endl;
        indent_down();

        out << indent() << "}" << endl
            << indent() << "await oprot.WriteMessageEndAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl
            << indent() << "await oprot.Transport.FlushAsync(" << CANCELLATION_TOKEN_NAME << ");" << endl;
    }

    indent_down();
    out << indent() << "}" << endl << endl;
}